

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O0

bool __thiscall QJsonArray::detach(QJsonArray *this,qsizetype reserve)

{
  bool bVar1;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_RSI;
  QCborContainerPrivate *in_stack_ffffffffffffffc8;
  QJsonArray *in_stack_ffffffffffffffd0;
  undefined1 local_1;
  
  bVar1 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x132251);
  if (bVar1) {
    local_1 = true;
  }
  else {
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x132268);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::data
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x132272);
    if (in_RSI == (QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x0) {
      in_RSI = (QExplicitlySharedDataPointer<QCborContainerPrivate> *)
               size(in_stack_ffffffffffffffd0);
    }
    QCborContainerPrivate::detach(in_stack_ffffffffffffffc8,0x1322a9);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=(in_RSI,in_stack_ffffffffffffffc8)
    ;
    local_1 = QExplicitlySharedDataPointer::operator_cast_to_bool
                        ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1322c0);
  }
  return local_1;
}

Assistant:

bool QJsonArray::detach(qsizetype reserve)
{
    if (!a)
        return true;
    a = a->detach(a.data(), reserve ? reserve : size());
    return a;
}